

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::SimpleLeggedOdometry::getWorldLinkTransform
          (SimpleLeggedOdometry *this,LinkIndex link_index)

{
  ulong uVar1;
  Transform *pTVar2;
  long in_RDX;
  long in_RSI;
  Transform *in_RDI;
  Transform base_H_link;
  Transform base_H_fixed;
  Transform local_138 [96];
  Transform local_d8 [96];
  Transform local_78 [96];
  long local_18;
  
  if (((*(byte *)(in_RSI + 0x191) & 1) == 0) || ((*(byte *)(in_RSI + 0x192) & 1) == 0)) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","getWorldLinkTransform",
               "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted."
              );
    iDynTree::Transform::Identity();
  }
  else {
    local_18 = in_RDX;
    uVar1 = iDynTree::Model::isValidLinkIndex(in_RSI);
    if ((uVar1 & 1) == 0) {
      iDynTree::reportError
                ("SimpleLeggedOdometry","getWorldLinkTransform",
                 "getWorldLinkTransform was called, but the request linkindex is not part of the model"
                );
      iDynTree::Transform::Identity();
    }
    else {
      pTVar2 = (Transform *)
               iDynTree::LinkPositions::operator()
                         ((LinkPositions *)(in_RSI + 0x1a0),*(long *)(in_RSI + 0x198));
      iDynTree::Transform::Transform(local_78,pTVar2);
      pTVar2 = (Transform *)
               iDynTree::LinkPositions::operator()((LinkPositions *)(in_RSI + 0x1a0),local_18);
      iDynTree::Transform::Transform(local_d8,pTVar2);
      iDynTree::Transform::inverse();
      iDynTree::Transform::operator*(local_138,(Transform *)(in_RSI + 0x1b8));
      iDynTree::Transform::operator*(in_RDI,local_138);
    }
  }
  return in_RDI;
}

Assistant:

Transform SimpleLeggedOdometry::getWorldLinkTransform(const LinkIndex link_index)
{
    if( !this->m_kinematicsUpdated || !this->m_isOdometryInitialized  )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldLinkTransform",
                    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted.");
        return Transform::Identity();
    }

    if( !this->m_model.isValidLinkIndex(link_index) )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldLinkTransform",
                    "getWorldLinkTransform was called, but the request linkindex is not part of the model");
        return Transform::Identity();
    }

    assert(m_fixedLinkIndex < static_cast<LinkIndex>(m_base_H_link.getNrOfLinks()));
    Transform base_H_fixed = m_base_H_link(m_fixedLinkIndex);
    Transform base_H_link =  m_base_H_link(link_index);

    return m_world_H_fixedLink*base_H_fixed.inverse()*base_H_link;
}